

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t utf8_to_unicode(uint32_t *pwc,char *s,size_t n)

{
  size_t in_RDX;
  char *in_RSI;
  uint32_t *in_RDI;
  wchar_t cnt;
  wchar_t local_4;
  
  local_4 = _utf8_to_unicode(in_RDI,in_RSI,in_RDX);
  if (((local_4 == L'\x03') && (0xd7ff < *in_RDI)) && (*in_RDI < 0xe000)) {
    local_4 = L'\xfffffffd';
  }
  return local_4;
}

Assistant:

static int
utf8_to_unicode(uint32_t *pwc, const char *s, size_t n)
{
	int cnt;

	cnt = _utf8_to_unicode(pwc, s, n);
	/* Any of Surrogate pair is not leagal Unicode values. */
	if (cnt == 3 && IS_SURROGATE_PAIR_LA(*pwc))
		return (-3);
	return (cnt);
}